

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffmkky(char *keyname,char *value,char *comm,char *card,int *status)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  int local_10c;
  size_t local_108;
  char *local_100;
  char *local_f8;
  int *local_f0;
  char *local_e8;
  undefined8 local_e0;
  char tmpname [75];
  char tmpname2 [75];
  
  local_10c = -1;
  if (0 < *status) {
    return *status;
  }
  tmpname[0] = '\0';
  tmpname2[0] = '\0';
  *card = '\0';
  pcVar7 = keyname + -1;
  do {
    pcVar1 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
  } while (*pcVar1 == ' ');
  local_e8 = keyname;
  strncat(tmpname,pcVar7,0x4a);
  local_108 = strlen(value);
  sVar6 = strlen(tmpname);
  if (sVar6 == 0) {
    sVar6 = 0;
  }
  else {
    for (; tmpname[sVar6 - 1] == ' '; sVar6 = sVar6 - 1) {
      tmpname[sVar6 - 1] = '\0';
    }
  }
  pcVar7 = strchr(tmpname,0x3d);
  if (pcVar7 != (char *)0x0) {
    pcVar7 = "Illegal keyword name; contains an equals sign (=)";
LAB_0012e2e2:
    ffpmsg(pcVar7);
    pcVar7 = tmpname;
    goto LAB_0012e2ec;
  }
  local_100 = comm;
  local_f8 = value;
  if ((sVar6 < 9) && (iVar4 = fftkey(tmpname,&local_10c), iVar4 < 1)) {
    strcat(card,tmpname);
    for (; sVar6 != 8; sVar6 = sVar6 + 1) {
      card[sVar6] = ' ';
    }
    card[8] = '=';
    card[9] = ' ';
    card[10] = '\0';
    if (local_108 == 0) {
      iVar4 = 0;
      bVar3 = false;
      goto LAB_0012e6bc;
    }
    uVar9 = 10;
    bVar3 = false;
    iVar4 = 0;
    if (*value == '\'') {
LAB_0012e594:
      strncat(card,local_f8,0x50 - uVar9);
      uVar9 = local_108 + uVar9;
      uVar10 = uVar9;
      if (0x4f < uVar9) {
        card[0x4f] = '\'';
        uVar10 = 0x50;
      }
      if (local_100 == (char *)0x0) goto LAB_0012e6d7;
      if ((uVar9 < 0x1e) && (*local_100 != '\0')) {
        for (; uVar10 != 0x1e; uVar10 = uVar10 + 1) {
          card[uVar10] = ' ';
        }
        card[0x1e] = '\0';
        uVar10 = 0x1e;
      }
    }
    else {
LAB_0012e602:
      uVar10 = local_108 + uVar9;
      if (0x50 < uVar10) goto LAB_0012e60b;
      local_108 = uVar10;
      if (uVar10 < 0x1e) {
        strncat(card,"                    ",0x1e - uVar10);
      }
      strncat(card,local_f8,0x50 - uVar9);
      uVar10 = 0x1e;
      if (0x1e < local_108) {
        uVar10 = local_108;
      }
    }
    pcVar7 = local_100;
    if (((local_100 == (char *)0x0) || (0x4c < uVar10)) || (*local_100 == '\0')) goto LAB_0012e6d7;
    sVar6 = strlen(card);
    builtin_strncpy(card + sVar6," / ",4);
    sVar6 = 0x4d - uVar10;
  }
  else {
    if (tmpname[0] == 'h') {
      pcVar7 = "hierarch ";
LAB_0012e355:
      iVar4 = bcmp(tmpname,pcVar7,9);
      if (iVar4 != 0) goto LAB_0012e36a;
      strcat(card,tmpname);
      lVar2 = local_108 + sVar6;
      sVar8 = strlen(card);
      pcVar7 = card + sVar8;
      if (lVar2 + 3U < 0x51) {
        uVar9 = sVar6 + 3;
        builtin_strncpy(card + sVar8," = ",4);
      }
      else {
        pcVar7[2] = '\0';
        pcVar7[0] = '=';
        pcVar7[1] = ' ';
        uVar9 = sVar6 + 2;
      }
      iVar4 = 0;
      bVar3 = false;
    }
    else {
      if (tmpname[0] == 'H') {
        pcVar7 = "HIERARCH ";
        goto LAB_0012e355;
      }
LAB_0012e36a:
      local_f0 = status;
      local_e0 = card;
      strncat(tmpname2,tmpname,0x4a);
      pcVar7 = strtok(tmpname2," ");
      iVar4 = 0;
      bVar3 = false;
      while (card = local_e0, local_10c = -1, pcVar7 != (char *)0x0) {
        iVar5 = fftkey(pcVar7,&local_10c);
        if (0 < iVar5) {
          bVar3 = true;
        }
        pcVar7 = strtok((char *)0x0," ");
        iVar4 = iVar4 + 1;
      }
      if (iVar4 == 0) {
        iVar4 = fftkey(tmpname,&local_10c);
        card = local_e0;
        status = local_f0;
        if (0 < iVar4) {
          pcVar7 = "Illegal keyword name:";
          goto LAB_0012e2e2;
        }
        strncat(local_e0,tmpname,0x4a);
        sVar8 = strlen(card);
        (card + sVar8)[0] = '=';
        (card + sVar8)[1] = ' ';
        card[sVar8 + 2] = '\0';
        uVar9 = sVar6 + 2;
        iVar4 = 0;
      }
      else {
        if (sVar6 - 0x46 < 0xffffffffffffffaf) {
          ffpmsg("The following keyword is too long to fit on a card:");
          ffpmsg(local_e8);
          *local_f0 = 0xcf;
          return 0xcf;
        }
        sVar8 = strlen(local_e0);
        builtin_strncpy(card + sVar8,"HIERARCH ",10);
        strcat(card,tmpname);
        lVar2 = local_108 + sVar6;
        sVar8 = strlen(card);
        pcVar7 = card + sVar8;
        status = local_f0;
        if (lVar2 + 0xcU < 0x51) {
          uVar9 = sVar6 + 0xc;
          builtin_strncpy(card + sVar8," = ",4);
        }
        else {
          pcVar7[2] = '\0';
          pcVar7[0] = '=';
          pcVar7[1] = ' ';
          uVar9 = sVar6 + 0xb;
        }
      }
    }
    if (local_108 != 0) {
      if (*local_f8 != '\'') goto LAB_0012e602;
      if (uVar9 < 0x4e) goto LAB_0012e594;
LAB_0012e60b:
      ffpmsg("The following keyword + value is too long to fit on a card:");
      ffpmsg(local_e8);
      pcVar7 = local_f8;
LAB_0012e2ec:
      ffpmsg(pcVar7);
      *status = 0xcf;
      return 0xcf;
    }
    if (uVar9 != 10) goto LAB_0012e6d7;
LAB_0012e6bc:
    card[8] = ' ';
    if (local_100 == (char *)0x0) goto LAB_0012e6d7;
    sVar6 = 0x46;
    pcVar7 = local_100;
  }
  strncat(card,pcVar7,sVar6);
LAB_0012e6d7:
  if ((iVar4 == 1) || (bVar3)) {
    ffpmsg("Warning: the following keyword does not conform to the HIERARCH convention");
    ffpmsg(card);
  }
  return *status;
}

Assistant:

int ffmkky(const char *keyname,   /* I - keyword name    */
            char *value,     /* I - keyword value   */
            const char *comm,      /* I - keyword comment */
            char *card,      /* O - constructed keyword card */
            int  *status)    /* IO - status value   */
/*
  Make a complete FITS 80-byte keyword card from the input name, value and
  comment strings. Output card is null terminated without any trailing blanks.
*/
{
    size_t namelen, len, ii;
    char tmpname[FLEN_KEYWORD], tmpname2[FLEN_KEYWORD],*cptr;
    char *saveptr;
    int tstatus = -1, nblank = 0, ntoken = 0, maxlen = 0, specialchar = 0;

    if (*status > 0)
        return(*status);

    *tmpname = '\0';
    *tmpname2 = '\0';
    *card = '\0';

    /* skip leading blanks in the name */
    while(*(keyname + nblank) == ' ')
        nblank++;

    strncat(tmpname, keyname + nblank, FLEN_KEYWORD - 1);

    len = strlen(value);        
    namelen = strlen(tmpname);

    /* delete non-significant trailing blanks in the name */
    if (namelen) {
        cptr = tmpname + namelen - 1;

        while(*cptr == ' ') {
            *cptr = '\0';
            cptr--;
        }

        namelen = cptr - tmpname + 1;
    }
    
    /* check that the name does not contain an '=' (equals sign) */
    if (strchr(tmpname, '=') ) {
        ffpmsg("Illegal keyword name; contains an equals sign (=)");
        ffpmsg(tmpname);
        return(*status = BAD_KEYCHAR);
    }

    if (namelen <= 8 && fftkey(tmpname, &tstatus) <= 0 ) { 
    
        /* a normal 8-char (or less) FITS keyword. */
        strcat(card, tmpname);   /* copy keyword name to buffer */
   
        for (ii = namelen; ii < 8; ii++)
            card[ii] = ' ';      /* pad keyword name with spaces */

        card[8]  = '=';          /* append '= ' in columns 9-10 */
        card[9]  = ' ';
        card[10] = '\0';        /* terminate the partial string */
        namelen = 10;
    } else if ((FSTRNCMP(tmpname, "HIERARCH ", 9) == 0) || 
               (FSTRNCMP(tmpname, "hierarch ", 9) == 0) ) {

        /* this is an explicit ESO HIERARCH keyword */

        strcat(card, tmpname);  /* copy keyword name to buffer */

        if (namelen + 3 + len > 80) {
            /* save 1 char by not putting a space before the equals sign */
            strcat(card, "= ");
            namelen += 2;
        } else {
            strcat(card, " = ");
            namelen += 3;
        }
    } else {

	/* scan the keyword name to determine the number and max length of the tokens */
	/* and test if any of the tokens contain nonstandard characters */
	
      	strncat(tmpname2, tmpname, FLEN_KEYWORD - 1);
        cptr = ffstrtok(tmpname2, " ",&saveptr);
	while (cptr) {
	    if (strlen(cptr) > maxlen) maxlen = strlen(cptr); /* find longest token */

	    /* name contains special characters? */
            tstatus = -1;  /* suppress any error message */
	    if (fftkey(cptr, &tstatus) > 0) specialchar = 1; 
	    
	    cptr = ffstrtok(NULL, " ",&saveptr);
	    ntoken++;
	}

        tstatus = -1;  /* suppress any error message */

/*      if (ntoken > 1) { */
        if (ntoken > 0) {  /*  temporarily change so that this case should always be true  */
	    /* for now at least, treat all cases as an implicit ESO HIERARCH keyword. */
	    /* This could  change if FITS is ever expanded to directly support longer keywords. */
	    
            if (namelen + 11 > FLEN_CARD-1)
            {
                ffpmsg(
               "The following keyword is too long to fit on a card:");
                ffpmsg(keyname);
                return(*status = BAD_KEYCHAR);
            }
            strcat(card, "HIERARCH ");
            strcat(card, tmpname);
	    namelen += 9;

            if (namelen + 3 + len > 80) {
                /* save 1 char by not putting a space before the equals sign */
                strcat(card, "= ");
                namelen += 2;
            } else {
                strcat(card, " = ");
                namelen += 3;
            }

	} else if ((fftkey(tmpname, &tstatus) <= 0)) {
          /* should never get here (at least for now) */
            /* allow keyword names longer than 8 characters */

            strncat(card, tmpname, FLEN_KEYWORD - 1);
            strcat(card, "= ");
            namelen += 2;
        } else {
          /* should never get here (at least for now) */
            ffpmsg("Illegal keyword name:");
            ffpmsg(tmpname);
            return(*status = BAD_KEYCHAR);
        }
    }

    if (len > 0)  /* now process the value string */
    {
        if (value[0] == '\'')  /* is this a quoted string value? */
        {
            if (namelen > 77)
            {
                ffpmsg(
               "The following keyword + value is too long to fit on a card:");
                ffpmsg(keyname);
                ffpmsg(value);
                return(*status = BAD_KEYCHAR);
            }

            strncat(card, value, 80 - namelen); /* append the value string */
            len = minvalue(80, namelen + len);

            /* restore the closing quote if it got truncated */
            if (len == 80)
            {
                   card[79] = '\'';
            }

            if (comm)
            {
              if (comm[0] != 0)
              {
                if (len < 30)
                {
                  for (ii = len; ii < 30; ii++)
                    card[ii] = ' '; /* fill with spaces to col 30 */

                  card[30] = '\0';
                  len = 30;
                }
              }
            }
        }
        else
        {
            if (namelen + len > 80)
            {
                ffpmsg(
               "The following keyword + value is too long to fit on a card:");
                ffpmsg(keyname);
                ffpmsg(value);
                return(*status = BAD_KEYCHAR);
            }
            else if (namelen + len < 30)
            {
                /* add spaces so field ends at least in col 30 */
                strncat(card, "                    ", 30 - (namelen + len));
            }

            strncat(card, value, 80 - namelen); /* append the value string */
            len = minvalue(80, namelen + len);
            len = maxvalue(30, len);
        }

        if (comm)
        {
          if ((len < 77) && ( strlen(comm) > 0) )  /* room for a comment? */
          {
            strcat(card, " / ");   /* append comment separator */
            strncat(card, comm, 77 - len); /* append comment (what fits) */
          } 
        }
    }
    else
    {
      if (namelen == 10)  /* This case applies to normal keywords only */
      {
        card[8] = ' '; /* keywords with no value have no '=' */ 
        if (comm)
        {
          strncat(card, comm, 80 - namelen); /* append comment (what fits) */
        }
      }
    }

    /* issue a warning if this keyword does not strictly conform to the standard
	       HIERARCH convention, which requires,
	         1) at least 2 tokens in the name,
		 2) no tokens longer than 8 characters, and
		 3) no special characters in any of the tokens */

            if (ntoken == 1 || specialchar == 1) {
	       ffpmsg("Warning: the following keyword does not conform to the HIERARCH convention");
	     /*  ffpmsg(" (e.g., name is not hierarchical or contains non-standard characters)."); */
	       ffpmsg(card);
	    }

    return(*status);
}